

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

bool __thiscall QMakeEvaluator::isActiveConfig(QMakeEvaluator *this,QStringView config,bool regex)

{
  char cVar1;
  undefined1 uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ProString *configValue;
  ProString *this_00;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QRegularExpression re;
  QRegularExpressionMatch local_60 [8];
  QArrayDataPointer<ProString> local_58;
  undefined1 *local_40;
  long local_38;
  
  lVar6 = config.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (QMakeInternal::statics._40_8_ == lVar6) {
    QVar8.m_data = (storage_type_conflict *)QMakeInternal::statics._32_8_;
    QVar8.m_size = lVar6;
    cVar1 = QtPrivate::equalStrings(config,QVar8);
    uVar2 = 1;
    if (cVar1 != '\0') goto LAB_002813f5;
  }
  if (QMakeInternal::statics._64_8_ == lVar6) {
    QVar9.m_data = (storage_type_conflict *)QMakeInternal::statics._56_8_;
    QVar9.m_size = lVar6;
    cVar1 = QtPrivate::equalStrings(config,QVar9);
    if (cVar1 == '\0') goto LAB_00281181;
  }
  else {
LAB_00281181:
    if (QMakeInternal::statics._328_8_ == lVar6) {
      QVar10.m_data = (storage_type_conflict *)QMakeInternal::statics._320_8_;
      QVar10.m_size = lVar6;
      cVar1 = QtPrivate::equalStrings(config,QVar10);
      if (cVar1 != '\0') {
        uVar2 = this->m_hostBuild;
        goto LAB_002813f5;
      }
    }
    if (regex) {
      local_58.d = (Data *)CONCAT62(local_58.d._2_6_,0x2a);
      QVar11.m_data = (storage_type_conflict *)&local_58;
      QVar11.m_size = 1;
      lVar4 = QtPrivate::findString(config,0,QVar11,CaseSensitive);
      if (lVar4 == -1) {
        local_58.d = (Data *)CONCAT62(local_58.d._2_6_,0x3f);
        QVar12.m_data = (storage_type_conflict *)&local_58;
        QVar12.m_size = 1;
        lVar4 = QtPrivate::findString(config,0,QVar12,CaseSensitive);
        if (lVar4 == -1) goto LAB_0028137b;
      }
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)&local_58,(QChar *)config.m_data,lVar6);
      QRegularExpression::fromWildcard(&local_40,local_58.size,local_58.ptr,0,0);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      QRegularExpression::match(&local_58,&local_40,&this->m_qmakespecName,0,0,0);
      cVar1 = QRegularExpressionMatch::hasMatch();
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_58);
      if (cVar1 != '\0') {
LAB_002813e9:
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_40);
        uVar2 = 1;
        goto LAB_002813f5;
      }
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
      values((ProStringList *)&local_58,this,(ProKey *)(QMakeInternal::statics + 0x48));
      if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
        lVar6 = local_58.size * 0x30;
        this_00 = local_58.ptr;
        do {
          uVar5 = (long)this->m_toggle ^ 1;
          this->m_toggle = (int)uVar5;
          ProString::toQString(this_00,this->m_tmp + uVar5);
          QRegularExpression::match(local_60,&local_40,this->m_tmp + uVar5,0,0,0);
          cVar1 = QRegularExpressionMatch::hasMatch();
          QRegularExpressionMatch::~QRegularExpressionMatch(local_60);
          if (cVar1 != '\0') {
            QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
            goto LAB_002813e9;
          }
          this_00 = this_00 + 1;
          lVar6 = lVar6 + -0x30;
        } while (lVar6 != 0);
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
      QRegularExpression::~QRegularExpression((QRegularExpression *)&local_40);
    }
    else {
LAB_0028137b:
      if ((this->m_qmakespecName).d.size == lVar6) {
        QVar7.m_data = (this->m_qmakespecName).d.ptr;
        QVar7.m_size = lVar6;
        cVar1 = QtPrivate::equalStrings(QVar7,config);
        uVar2 = 1;
        if (cVar1 != '\0') goto LAB_002813f5;
      }
      values((ProStringList *)&local_58,this,(ProKey *)(QMakeInternal::statics + 0x48));
      bVar3 = ProStringList::contains((ProStringList *)&local_58,config,CaseSensitive);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
      uVar2 = 1;
      if (bVar3) goto LAB_002813f5;
    }
  }
  uVar2 = 0;
LAB_002813f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeEvaluator::isActiveConfig(QStringView config, bool regex)
{
    // magic types for easy flipping
    if (config == statics.strtrue)
        return true;
    if (config == statics.strfalse)
        return false;

    if (config == statics.strhost_build)
        return m_hostBuild;

    if (regex && (config.contains(QLatin1Char('*')) || config.contains(QLatin1Char('?')))) {
        auto re = QRegularExpression::fromWildcard(config.toString());

        // mkspecs
        if (re.match(m_qmakespecName).hasMatch())
            return true;

        // CONFIG variable
        const auto configValues = values(statics.strCONFIG);
        for (const ProString &configValue : configValues) {
            ProStringRoUser u1(configValue, m_tmp[m_toggle ^= 1]);
            if (re.match(u1.str()).hasMatch())
                return true;
        }
    } else {
        // mkspecs
        if (m_qmakespecName == config)
            return true;

        // CONFIG variable
        if (values(statics.strCONFIG).contains(config))
            return true;
    }

    return false;
}